

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

filemgr * filemgr_search_stale_links(filemgr *cur_file)

{
  filemgr *pfVar1;
  filemgr *very_old_file;
  hash *in_stack_00000018;
  
  pthread_spin_lock(&filemgr_openlock);
  pfVar1 = (filemgr *)hash_scan(in_stack_00000018,(hash_check_func *)cur_file,very_old_file);
  pthread_spin_unlock(&filemgr_openlock);
  return pfVar1;
}

Assistant:

struct filemgr *filemgr_search_stale_links(struct filemgr *cur_file) {
    struct filemgr *very_old_file;
    spin_lock(&filemgr_openlock);
    very_old_file = (struct filemgr *)hash_scan(&hash,
                                         _filemgr_check_stale_link, cur_file);
    spin_unlock(&filemgr_openlock);
    return very_old_file;
}